

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_read1_core(BGZF *fp,bcf1_t *v)

{
  int iVar1;
  ssize_t sVar2;
  ulong uVar3;
  uint32_t x [8];
  
  sVar2 = bgzf_read(fp,x,0x20);
  if ((int)sVar2 == 0) {
    iVar1 = -1;
  }
  else if ((int)sVar2 == 0x20) {
    bcf_clear(v);
    x[0] = x[0] - 0x18;
    ks_resize(&v->shared,(ulong)x[0]);
    ks_resize(&v->indiv,(ulong)x[1]);
    v->rid = x[2];
    v->pos = x[3];
    v->rlen = x[4];
    v->qual = (float)x[5];
    uVar3 = (ulong)x[7] << 0x28 | (ulong)x[6];
    *(ulong *)&v->field_0x10 = (ulong)(x[7] >> 0x18) << 0x20 | uVar3;
    (v->shared).l = (ulong)x[0];
    (v->indiv).l = (ulong)x[1];
    if (0xffffff < x[7] && ((x[7] & 0xffffff) == 0 || (ulong)x[1] == 0)) {
      *(ulong *)&v->field_0x10 = uVar3;
    }
    bgzf_read(fp,(v->shared).s,(ulong)x[0]);
    bgzf_read(fp,(v->indiv).s,(v->indiv).l);
    iVar1 = 0;
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

static inline int bcf_read1_core(BGZF *fp, bcf1_t *v)
{
    uint32_t x[8];
    int ret;
    if ((ret = bgzf_read(fp, x, 32)) != 32) {
        if (ret == 0) return -1;
        return -2;
    }
    bcf_clear1(v);
    x[0] -= 24; // to exclude six 32-bit integers
    ks_resize(&v->shared, x[0]);
    ks_resize(&v->indiv, x[1]);
    memcpy(v, x + 2, 16);
    v->n_allele = x[6]>>16; v->n_info = x[6]&0xffff;
    v->n_fmt = x[7]>>24; v->n_sample = x[7]&0xffffff;
    v->shared.l = x[0], v->indiv.l = x[1];

    // silent fix of broken BCFs produced by earlier versions of bcf_subset, prior to and including bd6ed8b4
    if ( (!v->indiv.l || !v->n_sample) && v->n_fmt ) v->n_fmt = 0;

    bgzf_read(fp, v->shared.s, v->shared.l);
    bgzf_read(fp, v->indiv.s, v->indiv.l);
    return 0;
}